

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall RPCCommandExecution::RPCCommandExecution(RPCCommandExecution *this,string *method)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  unique_lock<std::mutex> local_58;
  _List_node_base *local_48;
  _List_node_base *local_40;
  _List_node_base local_38;
  _List_node_base *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->it)._M_node = (_List_node_base *)0x0;
  local_58._M_device = (mutex_type *)&g_rpc_server_info;
  local_58._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_58);
  pcVar1 = (method->_M_dataplus)._M_p;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + method->_M_string_length);
  local_28 = (_List_node_base *)std::chrono::_V2::steady_clock::now();
  p_Var2 = (_List_node_base *)operator_new(0x38);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_48 == &local_38) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_38._M_next._1_7_,local_38._M_next._0_1_);
    p_Var2[2]._M_prev = local_38._M_prev;
  }
  else {
    p_Var2[1]._M_next = local_48;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_38._M_next._1_7_,local_38._M_next._0_1_);
  }
  p_Var2[1]._M_prev = local_40;
  local_40 = (_List_node_base *)0x0;
  local_38._M_next._0_1_ = 0;
  p_Var2[3]._M_next = local_28;
  local_48 = &local_38;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  g_rpc_server_info.active_commands.
  super__List_base<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>._M_impl.
  _M_node._M_size =
       g_rpc_server_info.active_commands.
       super__List_base<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>._M_impl.
       _M_node._M_size + 1;
  (this->it)._M_node = (_List_node_base *)p_Var2;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(local_38._M_next._1_7_,local_38._M_next._0_1_) + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit RPCCommandExecution(const std::string& method)
    {
        LOCK(g_rpc_server_info.mutex);
        it = g_rpc_server_info.active_commands.insert(g_rpc_server_info.active_commands.end(), {method, SteadyClock::now()});
    }